

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct16x16_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar11;
  int iVar12;
  undefined1 auVar10 [16];
  int iVar13;
  int iVar15;
  int iVar16;
  undefined1 auVar14 [16];
  int iVar17;
  int iVar18;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar19 [16];
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar33;
  int iVar34;
  int iVar35;
  undefined1 auVar32 [16];
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  int iVar49;
  uint uVar50;
  int iVar51;
  uint uVar52;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar53;
  uint uVar54;
  undefined1 auVar55 [16];
  int iVar56;
  int iVar60;
  int iVar61;
  undefined1 auVar57 [16];
  int iVar62;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar63;
  int iVar72;
  int iVar74;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar64;
  uint uVar73;
  uint uVar75;
  int iVar76;
  uint uVar77;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar78;
  uint uVar79;
  int iVar83;
  uint uVar84;
  int iVar85;
  uint uVar86;
  undefined1 auVar80 [16];
  int iVar87;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  uint uVar88;
  int iVar89;
  int iVar94;
  int iVar95;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int iVar96;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  int iVar97;
  int iVar98;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  undefined1 auVar99 [16];
  int iVar105;
  undefined1 auVar100 [16];
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar114;
  int iVar115;
  undefined1 auVar112 [16];
  int iVar116;
  undefined1 auVar113 [16];
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  
  auVar19 = ZEXT416((uint)bit);
  lVar4 = (long)bit * 0x100;
  iVar8 = -*(int *)((long)vert_filter_length_chroma + lVar4 + 0x200);
  iVar45 = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x1a0);
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x220);
  iVar7 = -iVar45;
  iVar11 = -*(int *)((long)vert_filter_length_chroma + lVar4 + 0x1f0);
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar4 + 0x230);
  iVar6 = -iVar9;
  iVar2 = 1 << ((char)bit - 1U & 0x1f);
  iVar5 = bd + (uint)(do_cols == 0) * 2;
  iVar3 = 0x8000;
  if (0xf < iVar5 + 6) {
    iVar3 = 1 << ((char)iVar5 + 5U & 0x1f);
  }
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x250);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1d0);
  auVar90._4_4_ = uVar1;
  auVar90._0_4_ = uVar1;
  auVar90._8_4_ = uVar1;
  auVar90._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x210);
  auVar82._4_4_ = uVar1;
  auVar82._0_4_ = uVar1;
  auVar82._8_4_ = uVar1;
  auVar82._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1b0);
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 400);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x170);
  auVar66._4_4_ = uVar1;
  auVar66._0_4_ = uVar1;
  auVar66._8_4_ = uVar1;
  auVar66._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x240);
  auVar99._4_4_ = uVar1;
  auVar99._0_4_ = uVar1;
  auVar99._8_4_ = uVar1;
  auVar99._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1c0);
  auVar68._4_4_ = uVar1;
  auVar68._0_4_ = uVar1;
  auVar68._8_4_ = uVar1;
  auVar68._12_4_ = uVar1;
  auVar70._4_4_ = iVar8;
  auVar70._0_4_ = iVar8;
  auVar70._8_4_ = iVar8;
  auVar70._12_4_ = iVar8;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x180);
  auVar112._4_4_ = uVar1;
  auVar112._0_4_ = uVar1;
  auVar112._8_4_ = uVar1;
  auVar112._12_4_ = uVar1;
  auVar47._4_4_ = iVar11;
  auVar47._0_4_ = iVar11;
  auVar47._8_4_ = iVar11;
  auVar47._12_4_ = iVar11;
  auVar80._4_4_ = iVar12;
  auVar80._0_4_ = iVar12;
  auVar80._8_4_ = iVar12;
  auVar80._12_4_ = iVar12;
  auVar14 = pmulld(auVar66,(undefined1  [16])in[1]);
  auVar66 = pmulld(auVar65,(undefined1  [16])in[1]);
  auVar48 = pmulld(auVar47,(undefined1  [16])in[7]);
  auVar91 = pmulld(auVar90,(undefined1  [16])in[7]);
  iVar13 = auVar14._0_4_ + iVar2 >> auVar19;
  iVar15 = auVar14._4_4_ + iVar2 >> auVar19;
  iVar16 = auVar14._8_4_ + iVar2 >> auVar19;
  iVar17 = auVar14._12_4_ + iVar2 >> auVar19;
  iVar63 = auVar66._0_4_ + iVar2 >> auVar19;
  iVar72 = auVar66._4_4_ + iVar2 >> auVar19;
  iVar74 = auVar66._8_4_ + iVar2 >> auVar19;
  iVar76 = auVar66._12_4_ + iVar2 >> auVar19;
  iVar44 = auVar48._0_4_ + iVar2 >> auVar19;
  iVar49 = auVar48._4_4_ + iVar2 >> auVar19;
  iVar51 = auVar48._8_4_ + iVar2 >> auVar19;
  iVar53 = auVar48._12_4_ + iVar2 >> auVar19;
  auVar14 = pmulld(auVar10,(undefined1  [16])in[5]);
  auVar48 = pmulld(auVar82,(undefined1  [16])in[5]);
  iVar89 = auVar91._0_4_ + iVar2 >> auVar19;
  iVar94 = auVar91._4_4_ + iVar2 >> auVar19;
  iVar95 = auVar91._8_4_ + iVar2 >> auVar19;
  iVar96 = auVar91._12_4_ + iVar2 >> auVar19;
  iVar8 = auVar14._0_4_ + iVar2 >> auVar19;
  iVar11 = auVar14._4_4_ + iVar2 >> auVar19;
  iVar12 = auVar14._8_4_ + iVar2 >> auVar19;
  iVar5 = auVar14._12_4_ + iVar2 >> auVar19;
  iVar36 = auVar48._0_4_ + iVar2 >> auVar19;
  iVar38 = auVar48._4_4_ + iVar2 >> auVar19;
  iVar40 = auVar48._8_4_ + iVar2 >> auVar19;
  iVar42 = auVar48._12_4_ + iVar2 >> auVar19;
  auVar48 = pmulld(auVar80,(undefined1  [16])in[3]);
  auVar14 = pmulld(auVar57,(undefined1  [16])in[3]);
  iVar78 = auVar48._0_4_ + iVar2 >> auVar19;
  iVar83 = auVar48._4_4_ + iVar2 >> auVar19;
  iVar85 = auVar48._8_4_ + iVar2 >> auVar19;
  iVar87 = auVar48._12_4_ + iVar2 >> auVar19;
  iVar56 = auVar14._0_4_ + iVar2 >> auVar19;
  iVar60 = auVar14._4_4_ + iVar2 >> auVar19;
  iVar61 = auVar14._8_4_ + iVar2 >> auVar19;
  iVar62 = auVar14._12_4_ + iVar2 >> auVar19;
  auVar14 = pmulld(auVar112,(undefined1  [16])in[2]);
  iVar111 = auVar14._0_4_ + iVar2 >> auVar19;
  iVar114 = auVar14._4_4_ + iVar2 >> auVar19;
  iVar115 = auVar14._8_4_ + iVar2 >> auVar19;
  iVar116 = auVar14._12_4_ + iVar2 >> auVar19;
  auVar14 = pmulld(auVar99,(undefined1  [16])in[2]);
  iVar97 = auVar14._0_4_ + iVar2 >> auVar19;
  iVar101 = auVar14._4_4_ + iVar2 >> auVar19;
  iVar103 = auVar14._8_4_ + iVar2 >> auVar19;
  iVar105 = auVar14._12_4_ + iVar2 >> auVar19;
  auVar14 = pmulld(auVar70,(undefined1  [16])in[6]);
  iVar31 = auVar14._0_4_ + iVar2 >> auVar19;
  iVar33 = auVar14._4_4_ + iVar2 >> auVar19;
  iVar34 = auVar14._8_4_ + iVar2 >> auVar19;
  iVar35 = auVar14._12_4_ + iVar2 >> auVar19;
  auVar14 = pmulld(auVar68,(undefined1  [16])in[6]);
  iVar27 = auVar14._0_4_ + iVar2 >> auVar19;
  iVar28 = auVar14._4_4_ + iVar2 >> auVar19;
  iVar29 = auVar14._8_4_ + iVar2 >> auVar19;
  iVar30 = auVar14._12_4_ + iVar2 >> auVar19;
  iVar18 = iVar44 + iVar63;
  iVar20 = iVar49 + iVar72;
  iVar21 = iVar51 + iVar74;
  iVar24 = iVar53 + iVar76;
  iVar63 = iVar63 - iVar44;
  iVar72 = iVar72 - iVar49;
  iVar74 = iVar74 - iVar51;
  iVar76 = iVar76 - iVar53;
  iVar44 = iVar78 + iVar36;
  iVar51 = iVar83 + iVar38;
  iVar22 = iVar85 + iVar40;
  iVar25 = iVar87 + iVar42;
  iVar78 = iVar78 - iVar36;
  iVar83 = iVar83 - iVar38;
  iVar85 = iVar85 - iVar40;
  iVar87 = iVar87 - iVar42;
  iVar49 = iVar56 + iVar8;
  iVar53 = iVar60 + iVar11;
  iVar23 = iVar61 + iVar12;
  iVar26 = iVar62 + iVar5;
  iVar56 = iVar56 - iVar8;
  iVar60 = iVar60 - iVar11;
  iVar61 = iVar61 - iVar12;
  iVar62 = iVar62 - iVar5;
  iVar37 = iVar89 + iVar13;
  iVar39 = iVar94 + iVar15;
  iVar41 = iVar95 + iVar16;
  iVar43 = iVar96 + iVar17;
  iVar13 = iVar13 - iVar89;
  iVar15 = iVar15 - iVar94;
  iVar16 = iVar16 - iVar95;
  iVar17 = iVar17 - iVar96;
  iVar36 = iVar31 + iVar97;
  iVar38 = iVar33 + iVar101;
  iVar40 = iVar34 + iVar103;
  iVar42 = iVar35 + iVar105;
  iVar97 = iVar97 - iVar31;
  iVar101 = iVar101 - iVar33;
  iVar103 = iVar103 - iVar34;
  iVar105 = iVar105 - iVar35;
  iVar11 = iVar27 + iVar111;
  iVar12 = iVar28 + iVar114;
  iVar31 = iVar29 + iVar115;
  iVar33 = iVar30 + iVar116;
  iVar111 = iVar111 - iVar27;
  iVar114 = iVar114 - iVar28;
  iVar115 = iVar115 - iVar29;
  iVar116 = iVar116 - iVar30;
  iVar8 = -iVar3;
  iVar3 = iVar3 + -1;
  auVar55._4_4_ = iVar9;
  auVar55._0_4_ = iVar9;
  auVar55._8_4_ = iVar9;
  auVar55._12_4_ = iVar9;
  auVar14._4_4_ = iVar7;
  auVar14._0_4_ = iVar7;
  auVar14._8_4_ = iVar7;
  auVar14._12_4_ = iVar7;
  uVar64 = (uint)(iVar63 < iVar8) * iVar8 | (uint)(iVar63 >= iVar8) * iVar63;
  uVar73 = (uint)(iVar72 < iVar8) * iVar8 | (uint)(iVar72 >= iVar8) * iVar72;
  uVar75 = (uint)(iVar74 < iVar8) * iVar8 | (uint)(iVar74 >= iVar8) * iVar74;
  uVar77 = (uint)(iVar76 < iVar8) * iVar8 | (uint)(iVar76 >= iVar8) * iVar76;
  auVar67._0_4_ = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  auVar67._4_4_ = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  auVar67._8_4_ = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  auVar67._12_4_ = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar13 < iVar8) * iVar8 | (uint)(iVar13 >= iVar8) * iVar13;
  uVar73 = (uint)(iVar15 < iVar8) * iVar8 | (uint)(iVar15 >= iVar8) * iVar15;
  uVar75 = (uint)(iVar16 < iVar8) * iVar8 | (uint)(iVar16 >= iVar8) * iVar16;
  uVar77 = (uint)(iVar17 < iVar8) * iVar8 | (uint)(iVar17 >= iVar8) * iVar17;
  auVar91._0_4_ = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  auVar91._4_4_ = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  auVar91._8_4_ = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  auVar91._12_4_ = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  auVar10 = pmulld(auVar67,auVar14);
  auVar92 = pmulld(auVar91,auVar55);
  auVar71._4_4_ = iVar45;
  auVar71._0_4_ = iVar45;
  auVar71._8_4_ = iVar45;
  auVar71._12_4_ = iVar45;
  auVar66 = pmulld((undefined1  [16])in[4],auVar71);
  auVar91 = pmulld(auVar91,auVar71);
  auVar68 = pmulld(auVar67,auVar55);
  auVar69._4_4_ = iVar6;
  auVar69._0_4_ = iVar6;
  auVar69._8_4_ = iVar6;
  auVar69._12_4_ = iVar6;
  uVar64 = (uint)(iVar78 < iVar8) * iVar8 | (uint)(iVar78 >= iVar8) * iVar78;
  uVar73 = (uint)(iVar83 < iVar8) * iVar8 | (uint)(iVar83 >= iVar8) * iVar83;
  uVar75 = (uint)(iVar85 < iVar8) * iVar8 | (uint)(iVar85 >= iVar8) * iVar85;
  uVar77 = (uint)(iVar87 < iVar8) * iVar8 | (uint)(iVar87 >= iVar8) * iVar87;
  auVar81._0_4_ = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  auVar81._4_4_ = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  auVar81._8_4_ = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  auVar81._12_4_ = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar56 < iVar8) * iVar8 | (uint)(iVar56 >= iVar8) * iVar56;
  uVar73 = (uint)(iVar60 < iVar8) * iVar8 | (uint)(iVar60 >= iVar8) * iVar60;
  uVar75 = (uint)(iVar61 < iVar8) * iVar8 | (uint)(iVar61 >= iVar8) * iVar61;
  uVar77 = (uint)(iVar62 < iVar8) * iVar8 | (uint)(iVar62 >= iVar8) * iVar62;
  auVar58._0_4_ = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  auVar58._4_4_ = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  auVar58._8_4_ = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  auVar58._12_4_ = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  auVar70 = pmulld(auVar69,auVar81);
  auVar32 = pmulld(auVar58,auVar14);
  auVar82 = pmulld(auVar81,auVar14);
  auVar14 = pmulld((undefined1  [16])in[4],auVar55);
  auVar59 = pmulld(auVar58,auVar55);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1e0);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  auVar71 = pmulld((undefined1  [16])*in,auVar48);
  iVar78 = auVar71._0_4_ + iVar2 >> auVar19;
  iVar83 = auVar71._4_4_ + iVar2 >> auVar19;
  iVar85 = auVar71._8_4_ + iVar2 >> auVar19;
  iVar87 = auVar71._12_4_ + iVar2 >> auVar19;
  iVar9 = auVar66._0_4_ + iVar2 >> auVar19;
  iVar6 = auVar66._4_4_ + iVar2 >> auVar19;
  iVar15 = auVar66._8_4_ + iVar2 >> auVar19;
  iVar16 = auVar66._12_4_ + iVar2 >> auVar19;
  iVar45 = auVar14._0_4_ + iVar2 >> auVar19;
  iVar5 = auVar14._4_4_ + iVar2 >> auVar19;
  iVar7 = auVar14._8_4_ + iVar2 >> auVar19;
  iVar13 = auVar14._12_4_ + iVar2 >> auVar19;
  iVar95 = iVar78 - iVar9;
  iVar96 = iVar83 - iVar6;
  iVar107 = iVar85 - iVar15;
  iVar109 = iVar87 - iVar16;
  iVar9 = iVar9 + iVar78;
  iVar6 = iVar6 + iVar83;
  iVar15 = iVar15 + iVar85;
  iVar16 = iVar16 + iVar87;
  iVar35 = iVar45 + iVar78;
  iVar76 = iVar5 + iVar83;
  iVar89 = iVar7 + iVar85;
  iVar94 = iVar13 + iVar87;
  iVar78 = iVar78 - iVar45;
  iVar83 = iVar83 - iVar5;
  iVar85 = iVar85 - iVar7;
  iVar87 = iVar87 - iVar13;
  uVar64 = (uint)(iVar97 < iVar8) * iVar8 | (uint)(iVar97 >= iVar8) * iVar97;
  uVar73 = (uint)(iVar101 < iVar8) * iVar8 | (uint)(iVar101 >= iVar8) * iVar101;
  uVar75 = (uint)(iVar103 < iVar8) * iVar8 | (uint)(iVar103 >= iVar8) * iVar103;
  uVar77 = (uint)(iVar105 < iVar8) * iVar8 | (uint)(iVar105 >= iVar8) * iVar105;
  auVar100._0_4_ = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  auVar100._4_4_ = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  auVar100._8_4_ = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  auVar100._12_4_ = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar111 < iVar8) * iVar8 | (uint)(iVar111 >= iVar8) * iVar111;
  uVar73 = (uint)(iVar114 < iVar8) * iVar8 | (uint)(iVar114 >= iVar8) * iVar114;
  uVar75 = (uint)(iVar115 < iVar8) * iVar8 | (uint)(iVar115 >= iVar8) * iVar115;
  uVar77 = (uint)(iVar116 < iVar8) * iVar8 | (uint)(iVar116 >= iVar8) * iVar116;
  auVar113._0_4_ = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  auVar113._4_4_ = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  auVar113._8_4_ = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  auVar113._12_4_ = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  auVar14 = pmulld(auVar100,auVar48);
  auVar66 = pmulld(auVar113,auVar48);
  uVar64 = (uint)(iVar18 < iVar8) * iVar8 | (uint)(iVar18 >= iVar8) * iVar18;
  uVar73 = (uint)(iVar20 < iVar8) * iVar8 | (uint)(iVar20 >= iVar8) * iVar20;
  uVar75 = (uint)(iVar21 < iVar8) * iVar8 | (uint)(iVar21 >= iVar8) * iVar21;
  uVar77 = (uint)(iVar24 < iVar8) * iVar8 | (uint)(iVar24 >= iVar8) * iVar24;
  uVar46 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar50 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar52 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar54 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar44 < iVar8) * iVar8 | (uint)(iVar44 >= iVar8) * iVar44;
  uVar73 = (uint)(iVar51 < iVar8) * iVar8 | (uint)(iVar51 >= iVar8) * iVar51;
  uVar75 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar77 = (uint)(iVar25 < iVar8) * iVar8 | (uint)(iVar25 >= iVar8) * iVar25;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  iVar98 = uVar64 + uVar46;
  iVar102 = uVar73 + uVar50;
  iVar104 = uVar75 + uVar52;
  iVar106 = uVar77 + uVar54;
  iVar29 = uVar46 - uVar64;
  iVar56 = uVar50 - uVar73;
  iVar61 = uVar52 - uVar75;
  iVar63 = uVar54 - uVar77;
  iVar111 = auVar92._0_4_ + iVar2 + auVar10._0_4_ >> auVar19;
  iVar114 = auVar92._4_4_ + iVar2 + auVar10._4_4_ >> auVar19;
  iVar115 = auVar92._8_4_ + iVar2 + auVar10._8_4_ >> auVar19;
  iVar116 = auVar92._12_4_ + iVar2 + auVar10._12_4_ >> auVar19;
  iVar45 = auVar32._0_4_ + iVar2 + auVar70._0_4_ >> auVar19;
  iVar5 = auVar32._4_4_ + iVar2 + auVar70._4_4_ >> auVar19;
  iVar7 = auVar32._8_4_ + iVar2 + auVar70._8_4_ >> auVar19;
  iVar13 = auVar32._12_4_ + iVar2 + auVar70._12_4_ >> auVar19;
  iVar30 = iVar45 + iVar111;
  iVar60 = iVar5 + iVar114;
  iVar62 = iVar7 + iVar115;
  iVar72 = iVar13 + iVar116;
  iVar111 = iVar111 - iVar45;
  iVar114 = iVar114 - iVar5;
  iVar115 = iVar115 - iVar7;
  iVar116 = iVar116 - iVar13;
  uVar64 = (uint)(iVar49 < iVar8) * iVar8 | (uint)(iVar49 >= iVar8) * iVar49;
  uVar73 = (uint)(iVar53 < iVar8) * iVar8 | (uint)(iVar53 >= iVar8) * iVar53;
  uVar75 = (uint)(iVar23 < iVar8) * iVar8 | (uint)(iVar23 >= iVar8) * iVar23;
  uVar77 = (uint)(iVar26 < iVar8) * iVar8 | (uint)(iVar26 >= iVar8) * iVar26;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar46 = (uint)(iVar37 < iVar8) * iVar8 | (uint)(iVar37 >= iVar8) * iVar37;
  uVar50 = (uint)(iVar39 < iVar8) * iVar8 | (uint)(iVar39 >= iVar8) * iVar39;
  uVar52 = (uint)(iVar41 < iVar8) * iVar8 | (uint)(iVar41 >= iVar8) * iVar41;
  uVar54 = (uint)(iVar43 < iVar8) * iVar8 | (uint)(iVar43 >= iVar8) * iVar43;
  uVar46 = (uint)(iVar3 < (int)uVar46) * iVar3 | (iVar3 >= (int)uVar46) * uVar46;
  uVar50 = (uint)(iVar3 < (int)uVar50) * iVar3 | (iVar3 >= (int)uVar50) * uVar50;
  uVar52 = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  iVar34 = uVar64 + uVar46;
  iVar37 = uVar73 + uVar50;
  iVar41 = uVar75 + uVar52;
  iVar74 = uVar77 + uVar54;
  iVar25 = uVar46 - uVar64;
  iVar26 = uVar50 - uVar73;
  iVar27 = uVar52 - uVar75;
  iVar28 = uVar54 - uVar77;
  iVar49 = auVar91._0_4_ + iVar2 + auVar68._0_4_ >> auVar19;
  iVar20 = auVar91._4_4_ + iVar2 + auVar68._4_4_ >> auVar19;
  iVar51 = auVar91._8_4_ + iVar2 + auVar68._8_4_ >> auVar19;
  iVar53 = auVar91._12_4_ + iVar2 + auVar68._12_4_ >> auVar19;
  iVar17 = auVar59._0_4_ + iVar2 + auVar82._0_4_ >> auVar19;
  iVar18 = auVar59._4_4_ + iVar2 + auVar82._4_4_ >> auVar19;
  iVar44 = auVar59._8_4_ + iVar2 + auVar82._8_4_ >> auVar19;
  iVar21 = auVar59._12_4_ + iVar2 + auVar82._12_4_ >> auVar19;
  iVar45 = iVar17 + iVar49;
  iVar5 = iVar18 + iVar20;
  iVar7 = iVar44 + iVar51;
  iVar13 = iVar21 + iVar53;
  iVar49 = iVar49 - iVar17;
  iVar20 = iVar20 - iVar18;
  iVar51 = iVar51 - iVar44;
  iVar53 = iVar53 - iVar21;
  uVar64 = (uint)(iVar11 < iVar8) * iVar8 | (uint)(iVar11 >= iVar8) * iVar11;
  uVar73 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  uVar75 = (uint)(iVar31 < iVar8) * iVar8 | (uint)(iVar31 >= iVar8) * iVar31;
  uVar77 = (uint)(iVar33 < iVar8) * iVar8 | (uint)(iVar33 >= iVar8) * iVar33;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar46 = (uint)(iVar9 < iVar8) * iVar8 | (uint)(iVar9 >= iVar8) * iVar9;
  uVar50 = (uint)(iVar6 < iVar8) * iVar8 | (uint)(iVar6 >= iVar8) * iVar6;
  uVar52 = (uint)(iVar15 < iVar8) * iVar8 | (uint)(iVar15 >= iVar8) * iVar15;
  uVar54 = (uint)(iVar16 < iVar8) * iVar8 | (uint)(iVar16 >= iVar8) * iVar16;
  uVar46 = (uint)(iVar3 < (int)uVar46) * iVar3 | (iVar3 >= (int)uVar46) * uVar46;
  uVar50 = (uint)(iVar3 < (int)uVar50) * iVar3 | (iVar3 >= (int)uVar50) * uVar50;
  uVar52 = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  iVar21 = uVar46 + uVar64;
  iVar22 = uVar50 + uVar73;
  iVar23 = uVar52 + uVar75;
  iVar24 = uVar54 + uVar77;
  iVar16 = uVar46 - uVar64;
  iVar17 = uVar50 - uVar73;
  iVar18 = uVar52 - uVar75;
  iVar44 = uVar54 - uVar77;
  uVar64 = (uint)(iVar35 < iVar8) * iVar8 | (uint)(iVar35 >= iVar8) * iVar35;
  uVar73 = (uint)(iVar76 < iVar8) * iVar8 | (uint)(iVar76 >= iVar8) * iVar76;
  uVar75 = (uint)(iVar89 < iVar8) * iVar8 | (uint)(iVar89 >= iVar8) * iVar89;
  uVar77 = (uint)(iVar94 < iVar8) * iVar8 | (uint)(iVar94 >= iVar8) * iVar94;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  iVar97 = auVar66._0_4_ + iVar2 + auVar14._0_4_ >> auVar19;
  iVar101 = auVar66._4_4_ + iVar2 + auVar14._4_4_ >> auVar19;
  iVar103 = auVar66._8_4_ + iVar2 + auVar14._8_4_ >> auVar19;
  iVar105 = auVar66._12_4_ + iVar2 + auVar14._12_4_ >> auVar19;
  iVar35 = iVar97 + uVar64;
  iVar39 = iVar101 + uVar73;
  iVar43 = iVar103 + uVar75;
  iVar76 = iVar105 + uVar77;
  iVar97 = uVar64 - iVar97;
  iVar101 = uVar73 - iVar101;
  iVar103 = uVar75 - iVar103;
  iVar105 = uVar77 - iVar105;
  uVar64 = (uint)(iVar78 < iVar8) * iVar8 | (uint)(iVar78 >= iVar8) * iVar78;
  uVar73 = (uint)(iVar83 < iVar8) * iVar8 | (uint)(iVar83 >= iVar8) * iVar83;
  uVar75 = (uint)(iVar85 < iVar8) * iVar8 | (uint)(iVar85 >= iVar8) * iVar85;
  uVar77 = (uint)(iVar87 < iVar8) * iVar8 | (uint)(iVar87 >= iVar8) * iVar87;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  iVar78 = (iVar2 - auVar14._0_4_) + auVar66._0_4_ >> auVar19;
  iVar83 = (iVar2 - auVar14._4_4_) + auVar66._4_4_ >> auVar19;
  iVar85 = (iVar2 - auVar14._8_4_) + auVar66._8_4_ >> auVar19;
  iVar87 = (iVar2 - auVar14._12_4_) + auVar66._12_4_ >> auVar19;
  iVar9 = iVar78 + uVar64;
  iVar12 = iVar83 + uVar73;
  iVar31 = iVar85 + uVar75;
  iVar15 = iVar87 + uVar77;
  iVar78 = uVar64 - iVar78;
  iVar83 = uVar73 - iVar83;
  iVar85 = uVar75 - iVar85;
  iVar87 = uVar77 - iVar87;
  uVar64 = (uint)(iVar36 < iVar8) * iVar8 | (uint)(iVar36 >= iVar8) * iVar36;
  uVar73 = (uint)(iVar38 < iVar8) * iVar8 | (uint)(iVar38 >= iVar8) * iVar38;
  uVar75 = (uint)(iVar40 < iVar8) * iVar8 | (uint)(iVar40 >= iVar8) * iVar40;
  uVar77 = (uint)(iVar42 < iVar8) * iVar8 | (uint)(iVar42 >= iVar8) * iVar42;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar46 = (uint)(iVar95 < iVar8) * iVar8 | (uint)(iVar95 >= iVar8) * iVar95;
  uVar50 = (uint)(iVar96 < iVar8) * iVar8 | (uint)(iVar96 >= iVar8) * iVar96;
  uVar52 = (uint)(iVar107 < iVar8) * iVar8 | (uint)(iVar107 >= iVar8) * iVar107;
  uVar54 = (uint)(iVar109 < iVar8) * iVar8 | (uint)(iVar109 >= iVar8) * iVar109;
  uVar46 = (uint)(iVar3 < (int)uVar46) * iVar3 | (iVar3 >= (int)uVar46) * uVar46;
  uVar50 = (uint)(iVar3 < (int)uVar50) * iVar3 | (iVar3 >= (int)uVar50) * uVar50;
  uVar52 = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  iVar89 = uVar46 + uVar64;
  iVar94 = uVar50 + uVar73;
  iVar95 = uVar52 + uVar75;
  iVar96 = uVar54 + uVar77;
  iVar107 = uVar46 - uVar64;
  iVar109 = uVar50 - uVar73;
  iVar108 = uVar52 - uVar75;
  iVar110 = uVar54 - uVar77;
  uVar64 = (uint)(iVar111 < iVar8) * iVar8 | (uint)(iVar111 >= iVar8) * iVar111;
  uVar73 = (uint)(iVar114 < iVar8) * iVar8 | (uint)(iVar114 >= iVar8) * iVar114;
  uVar75 = (uint)(iVar115 < iVar8) * iVar8 | (uint)(iVar115 >= iVar8) * iVar115;
  uVar77 = (uint)(iVar116 < iVar8) * iVar8 | (uint)(iVar116 >= iVar8) * iVar116;
  auVar93._0_4_ = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  auVar93._4_4_ = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  auVar93._8_4_ = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  auVar93._12_4_ = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar49 < iVar8) * iVar8 | (uint)(iVar49 >= iVar8) * iVar49;
  uVar73 = (uint)(iVar20 < iVar8) * iVar8 | (uint)(iVar20 >= iVar8) * iVar20;
  uVar75 = (uint)(iVar51 < iVar8) * iVar8 | (uint)(iVar51 >= iVar8) * iVar51;
  uVar77 = (uint)(iVar53 < iVar8) * iVar8 | (uint)(iVar53 >= iVar8) * iVar53;
  auVar32._0_4_ = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  auVar32._4_4_ = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  auVar32._8_4_ = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  auVar32._12_4_ = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  auVar66 = pmulld(auVar93,auVar48);
  auVar14 = pmulld(auVar32,auVar48);
  uVar64 = (uint)(iVar29 < iVar8) * iVar8 | (uint)(iVar29 >= iVar8) * iVar29;
  uVar73 = (uint)(iVar56 < iVar8) * iVar8 | (uint)(iVar56 >= iVar8) * iVar56;
  uVar75 = (uint)(iVar61 < iVar8) * iVar8 | (uint)(iVar61 >= iVar8) * iVar61;
  uVar77 = (uint)(iVar63 < iVar8) * iVar8 | (uint)(iVar63 >= iVar8) * iVar63;
  auVar59._0_4_ = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  auVar59._4_4_ = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  auVar59._8_4_ = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  auVar59._12_4_ = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar25 < iVar8) * iVar8 | (uint)(iVar25 >= iVar8) * iVar25;
  uVar73 = (uint)(iVar26 < iVar8) * iVar8 | (uint)(iVar26 >= iVar8) * iVar26;
  uVar75 = (uint)(iVar27 < iVar8) * iVar8 | (uint)(iVar27 >= iVar8) * iVar27;
  uVar77 = (uint)(iVar28 < iVar8) * iVar8 | (uint)(iVar28 >= iVar8) * iVar28;
  auVar92._0_4_ = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  auVar92._4_4_ = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  auVar92._8_4_ = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  auVar92._12_4_ = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  auVar10 = pmulld(auVar59,auVar48);
  auVar48 = pmulld(auVar92,auVar48);
  iVar29 = (iVar2 - auVar66._0_4_) + auVar14._0_4_ >> auVar19;
  iVar56 = (iVar2 - auVar66._4_4_) + auVar14._4_4_ >> auVar19;
  iVar61 = (iVar2 - auVar66._8_4_) + auVar14._8_4_ >> auVar19;
  iVar63 = (iVar2 - auVar66._12_4_) + auVar14._12_4_ >> auVar19;
  iVar11 = auVar66._0_4_ + iVar2 + auVar14._0_4_ >> auVar19;
  iVar6 = auVar66._4_4_ + iVar2 + auVar14._4_4_ >> auVar19;
  iVar33 = auVar66._8_4_ + iVar2 + auVar14._8_4_ >> auVar19;
  iVar36 = auVar66._12_4_ + iVar2 + auVar14._12_4_ >> auVar19;
  iVar25 = (iVar2 - auVar10._0_4_) + auVar48._0_4_ >> auVar19;
  iVar26 = (iVar2 - auVar10._4_4_) + auVar48._4_4_ >> auVar19;
  iVar27 = (iVar2 - auVar10._8_4_) + auVar48._8_4_ >> auVar19;
  iVar28 = (iVar2 - auVar10._12_4_) + auVar48._12_4_ >> auVar19;
  iVar49 = auVar48._0_4_ + iVar2 + auVar10._0_4_ >> auVar19;
  iVar20 = auVar48._4_4_ + iVar2 + auVar10._4_4_ >> auVar19;
  iVar51 = auVar48._8_4_ + iVar2 + auVar10._8_4_ >> auVar19;
  iVar53 = auVar48._12_4_ + iVar2 + auVar10._12_4_ >> auVar19;
  uVar64 = (uint)(iVar34 < iVar8) * iVar8 | (uint)(iVar34 >= iVar8) * iVar34;
  uVar73 = (uint)(iVar37 < iVar8) * iVar8 | (uint)(iVar37 >= iVar8) * iVar37;
  uVar75 = (uint)(iVar41 < iVar8) * iVar8 | (uint)(iVar41 >= iVar8) * iVar41;
  uVar77 = (uint)(iVar74 < iVar8) * iVar8 | (uint)(iVar74 >= iVar8) * iVar74;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar46 = (uint)(iVar21 < iVar8) * iVar8 | (uint)(iVar21 >= iVar8) * iVar21;
  uVar50 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar52 = (uint)(iVar23 < iVar8) * iVar8 | (uint)(iVar23 >= iVar8) * iVar23;
  uVar54 = (uint)(iVar24 < iVar8) * iVar8 | (uint)(iVar24 >= iVar8) * iVar24;
  uVar46 = (uint)(iVar3 < (int)uVar46) * iVar3 | (iVar3 >= (int)uVar46) * uVar46;
  uVar50 = (uint)(iVar3 < (int)uVar50) * iVar3 | (iVar3 >= (int)uVar50) * uVar50;
  uVar52 = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  iVar21 = uVar46 + uVar64;
  iVar22 = uVar50 + uVar73;
  iVar23 = uVar52 + uVar75;
  iVar24 = uVar54 + uVar77;
  iVar2 = uVar46 - uVar64;
  iVar38 = uVar50 - uVar73;
  iVar40 = uVar52 - uVar75;
  iVar42 = uVar54 - uVar77;
  uVar64 = (uint)(iVar21 < iVar8) * iVar8 | (uint)(iVar21 >= iVar8) * iVar21;
  uVar73 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar75 = (uint)(iVar23 < iVar8) * iVar8 | (uint)(iVar23 >= iVar8) * iVar23;
  uVar77 = (uint)(iVar24 < iVar8) * iVar8 | (uint)(iVar24 >= iVar8) * iVar24;
  *(uint *)*out = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)*out + 4) = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(*out + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar2 < iVar8) * iVar8 | (uint)(iVar2 >= iVar8) * iVar2;
  uVar73 = (uint)(iVar38 < iVar8) * iVar8 | (uint)(iVar38 >= iVar8) * iVar38;
  uVar75 = (uint)(iVar40 < iVar8) * iVar8 | (uint)(iVar40 >= iVar8) * iVar40;
  uVar77 = (uint)(iVar42 < iVar8) * iVar8 | (uint)(iVar42 >= iVar8) * iVar42;
  *(uint *)out[0xf] = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)out[0xf] + 4) =
       (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(out[0xf] + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)out[0xf] + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar45 < iVar8) * iVar8 | (uint)(iVar45 >= iVar8) * iVar45;
  uVar73 = (uint)(iVar5 < iVar8) * iVar8 | (uint)(iVar5 >= iVar8) * iVar5;
  uVar75 = (uint)(iVar7 < iVar8) * iVar8 | (uint)(iVar7 >= iVar8) * iVar7;
  uVar77 = (uint)(iVar13 < iVar8) * iVar8 | (uint)(iVar13 >= iVar8) * iVar13;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar46 = (uint)(iVar35 < iVar8) * iVar8 | (uint)(iVar35 >= iVar8) * iVar35;
  uVar50 = (uint)(iVar39 < iVar8) * iVar8 | (uint)(iVar39 >= iVar8) * iVar39;
  uVar52 = (uint)(iVar43 < iVar8) * iVar8 | (uint)(iVar43 >= iVar8) * iVar43;
  uVar54 = (uint)(iVar76 < iVar8) * iVar8 | (uint)(iVar76 >= iVar8) * iVar76;
  uVar46 = (uint)(iVar3 < (int)uVar46) * iVar3 | (iVar3 >= (int)uVar46) * uVar46;
  uVar50 = (uint)(iVar3 < (int)uVar50) * iVar3 | (iVar3 >= (int)uVar50) * uVar50;
  uVar52 = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  iVar45 = uVar46 + uVar64;
  iVar2 = uVar50 + uVar73;
  iVar5 = uVar52 + uVar75;
  iVar7 = uVar54 + uVar77;
  iVar13 = uVar46 - uVar64;
  iVar38 = uVar50 - uVar73;
  iVar40 = uVar52 - uVar75;
  iVar42 = uVar54 - uVar77;
  uVar64 = (uint)(iVar45 < iVar8) * iVar8 | (uint)(iVar45 >= iVar8) * iVar45;
  uVar73 = (uint)(iVar2 < iVar8) * iVar8 | (uint)(iVar2 >= iVar8) * iVar2;
  uVar75 = (uint)(iVar5 < iVar8) * iVar8 | (uint)(iVar5 >= iVar8) * iVar5;
  uVar77 = (uint)(iVar7 < iVar8) * iVar8 | (uint)(iVar7 >= iVar8) * iVar7;
  *(uint *)out[1] = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(out[1] + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar9 < iVar8) * iVar8 | (uint)(iVar9 >= iVar8) * iVar9;
  uVar73 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  uVar75 = (uint)(iVar31 < iVar8) * iVar8 | (uint)(iVar31 >= iVar8) * iVar31;
  uVar77 = (uint)(iVar15 < iVar8) * iVar8 | (uint)(iVar15 >= iVar8) * iVar15;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar46 = (uint)(iVar13 < iVar8) * iVar8 | (uint)(iVar13 >= iVar8) * iVar13;
  uVar50 = (uint)(iVar38 < iVar8) * iVar8 | (uint)(iVar38 >= iVar8) * iVar38;
  uVar52 = (uint)(iVar40 < iVar8) * iVar8 | (uint)(iVar40 >= iVar8) * iVar40;
  uVar54 = (uint)(iVar42 < iVar8) * iVar8 | (uint)(iVar42 >= iVar8) * iVar42;
  *(uint *)out[0xe] = (uint)(iVar3 < (int)uVar46) * iVar3 | (iVar3 >= (int)uVar46) * uVar46;
  *(uint *)((long)out[0xe] + 4) =
       (uint)(iVar3 < (int)uVar50) * iVar3 | (iVar3 >= (int)uVar50) * uVar50;
  *(uint *)(out[0xe] + 1) = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  *(uint *)((long)out[0xe] + 0xc) =
       (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  iVar45 = iVar11 + uVar64;
  iVar9 = iVar6 + uVar73;
  iVar12 = iVar33 + uVar75;
  iVar2 = iVar36 + uVar77;
  iVar11 = uVar64 - iVar11;
  iVar6 = uVar73 - iVar6;
  iVar33 = uVar75 - iVar33;
  iVar36 = uVar77 - iVar36;
  uVar64 = (uint)(iVar45 < iVar8) * iVar8 | (uint)(iVar45 >= iVar8) * iVar45;
  uVar73 = (uint)(iVar9 < iVar8) * iVar8 | (uint)(iVar9 >= iVar8) * iVar9;
  uVar75 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  uVar77 = (uint)(iVar2 < iVar8) * iVar8 | (uint)(iVar2 >= iVar8) * iVar2;
  *(uint *)out[2] = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(out[2] + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar89 < iVar8) * iVar8 | (uint)(iVar89 >= iVar8) * iVar89;
  uVar73 = (uint)(iVar94 < iVar8) * iVar8 | (uint)(iVar94 >= iVar8) * iVar94;
  uVar75 = (uint)(iVar95 < iVar8) * iVar8 | (uint)(iVar95 >= iVar8) * iVar95;
  uVar77 = (uint)(iVar96 < iVar8) * iVar8 | (uint)(iVar96 >= iVar8) * iVar96;
  uVar46 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar50 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar52 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar54 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar11 < iVar8) * iVar8 | (uint)(iVar11 >= iVar8) * iVar11;
  uVar73 = (uint)(iVar6 < iVar8) * iVar8 | (uint)(iVar6 >= iVar8) * iVar6;
  uVar75 = (uint)(iVar33 < iVar8) * iVar8 | (uint)(iVar33 >= iVar8) * iVar33;
  uVar77 = (uint)(iVar36 < iVar8) * iVar8 | (uint)(iVar36 >= iVar8) * iVar36;
  *(uint *)out[0xd] = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)out[0xd] + 4) =
       (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(out[0xd] + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)out[0xd] + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  iVar45 = iVar49 + uVar46;
  iVar9 = iVar20 + uVar50;
  iVar11 = iVar51 + uVar52;
  iVar12 = iVar53 + uVar54;
  iVar49 = uVar46 - iVar49;
  iVar20 = uVar50 - iVar20;
  iVar51 = uVar52 - iVar51;
  iVar53 = uVar54 - iVar53;
  uVar64 = (uint)(iVar45 < iVar8) * iVar8 | (uint)(iVar45 >= iVar8) * iVar45;
  uVar73 = (uint)(iVar9 < iVar8) * iVar8 | (uint)(iVar9 >= iVar8) * iVar9;
  uVar75 = (uint)(iVar11 < iVar8) * iVar8 | (uint)(iVar11 >= iVar8) * iVar11;
  uVar77 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  *(uint *)out[3] = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(out[3] + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar107 < iVar8) * iVar8 | (uint)(iVar107 >= iVar8) * iVar107;
  uVar73 = (uint)(iVar109 < iVar8) * iVar8 | (uint)(iVar109 >= iVar8) * iVar109;
  uVar75 = (uint)(iVar108 < iVar8) * iVar8 | (uint)(iVar108 >= iVar8) * iVar108;
  uVar77 = (uint)(iVar110 < iVar8) * iVar8 | (uint)(iVar110 >= iVar8) * iVar110;
  uVar46 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar50 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar52 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar54 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar49 < iVar8) * iVar8 | (uint)(iVar49 >= iVar8) * iVar49;
  uVar73 = (uint)(iVar20 < iVar8) * iVar8 | (uint)(iVar20 >= iVar8) * iVar20;
  uVar75 = (uint)(iVar51 < iVar8) * iVar8 | (uint)(iVar51 >= iVar8) * iVar51;
  uVar77 = (uint)(iVar53 < iVar8) * iVar8 | (uint)(iVar53 >= iVar8) * iVar53;
  *(uint *)out[0xc] = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)out[0xc] + 4) =
       (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(out[0xc] + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)out[0xc] + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  iVar45 = iVar25 + uVar46;
  iVar9 = iVar26 + uVar50;
  iVar11 = iVar27 + uVar52;
  iVar12 = iVar28 + uVar54;
  iVar25 = uVar46 - iVar25;
  iVar26 = uVar50 - iVar26;
  iVar27 = uVar52 - iVar27;
  iVar28 = uVar54 - iVar28;
  uVar64 = (uint)(iVar45 < iVar8) * iVar8 | (uint)(iVar45 >= iVar8) * iVar45;
  uVar73 = (uint)(iVar9 < iVar8) * iVar8 | (uint)(iVar9 >= iVar8) * iVar9;
  uVar75 = (uint)(iVar11 < iVar8) * iVar8 | (uint)(iVar11 >= iVar8) * iVar11;
  uVar77 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  *(uint *)out[4] = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(out[4] + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar78 < iVar8) * iVar8 | (uint)(iVar78 >= iVar8) * iVar78;
  uVar73 = (uint)(iVar83 < iVar8) * iVar8 | (uint)(iVar83 >= iVar8) * iVar83;
  uVar75 = (uint)(iVar85 < iVar8) * iVar8 | (uint)(iVar85 >= iVar8) * iVar85;
  uVar77 = (uint)(iVar87 < iVar8) * iVar8 | (uint)(iVar87 >= iVar8) * iVar87;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar46 = (uint)(iVar25 < iVar8) * iVar8 | (uint)(iVar25 >= iVar8) * iVar25;
  uVar50 = (uint)(iVar26 < iVar8) * iVar8 | (uint)(iVar26 >= iVar8) * iVar26;
  uVar52 = (uint)(iVar27 < iVar8) * iVar8 | (uint)(iVar27 >= iVar8) * iVar27;
  uVar54 = (uint)(iVar28 < iVar8) * iVar8 | (uint)(iVar28 >= iVar8) * iVar28;
  *(uint *)out[0xb] = (uint)(iVar3 < (int)uVar46) * iVar3 | (iVar3 >= (int)uVar46) * uVar46;
  *(uint *)((long)out[0xb] + 4) =
       (uint)(iVar3 < (int)uVar50) * iVar3 | (iVar3 >= (int)uVar50) * uVar50;
  *(uint *)(out[0xb] + 1) = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  *(uint *)((long)out[0xb] + 0xc) =
       (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  iVar45 = uVar64 + iVar29;
  iVar9 = uVar73 + iVar56;
  iVar11 = uVar75 + iVar61;
  iVar12 = uVar77 + iVar63;
  iVar29 = uVar64 - iVar29;
  iVar56 = uVar73 - iVar56;
  iVar61 = uVar75 - iVar61;
  iVar63 = uVar77 - iVar63;
  uVar64 = (uint)(iVar45 < iVar8) * iVar8 | (uint)(iVar45 >= iVar8) * iVar45;
  uVar73 = (uint)(iVar9 < iVar8) * iVar8 | (uint)(iVar9 >= iVar8) * iVar9;
  uVar75 = (uint)(iVar11 < iVar8) * iVar8 | (uint)(iVar11 >= iVar8) * iVar11;
  uVar77 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  *(uint *)out[5] = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(out[5] + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar30 < iVar8) * iVar8 | (uint)(iVar30 >= iVar8) * iVar30;
  uVar73 = (uint)(iVar60 < iVar8) * iVar8 | (uint)(iVar60 >= iVar8) * iVar60;
  uVar75 = (uint)(iVar62 < iVar8) * iVar8 | (uint)(iVar62 >= iVar8) * iVar62;
  uVar77 = (uint)(iVar72 < iVar8) * iVar8 | (uint)(iVar72 >= iVar8) * iVar72;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar46 = (uint)(iVar97 < iVar8) * iVar8 | (uint)(iVar97 >= iVar8) * iVar97;
  uVar50 = (uint)(iVar101 < iVar8) * iVar8 | (uint)(iVar101 >= iVar8) * iVar101;
  uVar52 = (uint)(iVar103 < iVar8) * iVar8 | (uint)(iVar103 >= iVar8) * iVar103;
  uVar54 = (uint)(iVar105 < iVar8) * iVar8 | (uint)(iVar105 >= iVar8) * iVar105;
  uVar79 = (uint)(iVar3 < (int)uVar46) * iVar3 | (iVar3 >= (int)uVar46) * uVar46;
  uVar84 = (uint)(iVar3 < (int)uVar50) * iVar3 | (iVar3 >= (int)uVar50) * uVar50;
  uVar86 = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  uVar88 = (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  uVar46 = (uint)(iVar29 < iVar8) * iVar8 | (uint)(iVar29 >= iVar8) * iVar29;
  uVar50 = (uint)(iVar56 < iVar8) * iVar8 | (uint)(iVar56 >= iVar8) * iVar56;
  uVar52 = (uint)(iVar61 < iVar8) * iVar8 | (uint)(iVar61 >= iVar8) * iVar61;
  uVar54 = (uint)(iVar63 < iVar8) * iVar8 | (uint)(iVar63 >= iVar8) * iVar63;
  *(uint *)out[10] = (uint)(iVar3 < (int)uVar46) * iVar3 | (iVar3 >= (int)uVar46) * uVar46;
  *(uint *)((long)out[10] + 4) =
       (uint)(iVar3 < (int)uVar50) * iVar3 | (iVar3 >= (int)uVar50) * uVar50;
  *(uint *)(out[10] + 1) = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  *(uint *)((long)out[10] + 0xc) =
       (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  iVar45 = uVar79 + uVar64;
  iVar9 = uVar84 + uVar73;
  iVar11 = uVar86 + uVar75;
  iVar12 = uVar88 + uVar77;
  iVar2 = uVar79 - uVar64;
  iVar5 = uVar84 - uVar73;
  iVar6 = uVar86 - uVar75;
  iVar7 = uVar88 - uVar77;
  uVar64 = (uint)(iVar45 < iVar8) * iVar8 | (uint)(iVar45 >= iVar8) * iVar45;
  uVar73 = (uint)(iVar9 < iVar8) * iVar8 | (uint)(iVar9 >= iVar8) * iVar9;
  uVar75 = (uint)(iVar11 < iVar8) * iVar8 | (uint)(iVar11 >= iVar8) * iVar11;
  uVar77 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  *(uint *)out[6] = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(out[6] + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar98 < iVar8) * iVar8 | (uint)(iVar98 >= iVar8) * iVar98;
  uVar73 = (uint)(iVar102 < iVar8) * iVar8 | (uint)(iVar102 >= iVar8) * iVar102;
  uVar75 = (uint)(iVar104 < iVar8) * iVar8 | (uint)(iVar104 >= iVar8) * iVar104;
  uVar77 = (uint)(iVar106 < iVar8) * iVar8 | (uint)(iVar106 >= iVar8) * iVar106;
  uVar46 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar50 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar52 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar54 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar64 = (uint)(iVar16 < iVar8) * iVar8 | (uint)(iVar16 >= iVar8) * iVar16;
  uVar73 = (uint)(iVar17 < iVar8) * iVar8 | (uint)(iVar17 >= iVar8) * iVar17;
  uVar75 = (uint)(iVar18 < iVar8) * iVar8 | (uint)(iVar18 >= iVar8) * iVar18;
  uVar77 = (uint)(iVar44 < iVar8) * iVar8 | (uint)(iVar44 >= iVar8) * iVar44;
  uVar64 = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  uVar73 = (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  uVar75 = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar2 < iVar8) * iVar8 | (uint)(iVar2 >= iVar8) * iVar2;
  uVar84 = (uint)(iVar5 < iVar8) * iVar8 | (uint)(iVar5 >= iVar8) * iVar5;
  uVar86 = (uint)(iVar6 < iVar8) * iVar8 | (uint)(iVar6 >= iVar8) * iVar6;
  uVar88 = (uint)(iVar7 < iVar8) * iVar8 | (uint)(iVar7 >= iVar8) * iVar7;
  *(uint *)out[9] = (uint)(iVar3 < (int)uVar79) * iVar3 | (iVar3 >= (int)uVar79) * uVar79;
  *(uint *)((long)out[9] + 4) =
       (uint)(iVar3 < (int)uVar84) * iVar3 | (iVar3 >= (int)uVar84) * uVar84;
  *(uint *)(out[9] + 1) = (uint)(iVar3 < (int)uVar86) * iVar3 | (iVar3 >= (int)uVar86) * uVar86;
  *(uint *)((long)out[9] + 0xc) =
       (uint)(iVar3 < (int)uVar88) * iVar3 | (iVar3 >= (int)uVar88) * uVar88;
  iVar45 = uVar64 + uVar46;
  iVar9 = uVar73 + uVar50;
  iVar11 = uVar75 + uVar52;
  iVar12 = uVar77 + uVar54;
  iVar2 = uVar64 - uVar46;
  iVar5 = uVar73 - uVar50;
  iVar6 = uVar75 - uVar52;
  iVar7 = uVar77 - uVar54;
  uVar64 = (uint)(iVar45 < iVar8) * iVar8 | (uint)(iVar45 >= iVar8) * iVar45;
  uVar73 = (uint)(iVar9 < iVar8) * iVar8 | (uint)(iVar9 >= iVar8) * iVar9;
  uVar75 = (uint)(iVar11 < iVar8) * iVar8 | (uint)(iVar11 >= iVar8) * iVar11;
  uVar77 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  uVar46 = (uint)(iVar2 < iVar8) * iVar8 | (uint)(iVar2 >= iVar8) * iVar2;
  uVar50 = (uint)(iVar5 < iVar8) * iVar8 | (uint)(iVar5 >= iVar8) * iVar5;
  uVar52 = (uint)(iVar6 < iVar8) * iVar8 | (uint)(iVar6 >= iVar8) * iVar6;
  uVar54 = (uint)(iVar7 < iVar8) * iVar8 | (uint)(iVar7 >= iVar8) * iVar7;
  *(uint *)out[7] = (uint)(iVar3 < (int)uVar64) * iVar3 | (iVar3 >= (int)uVar64) * uVar64;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar3 < (int)uVar73) * iVar3 | (iVar3 >= (int)uVar73) * uVar73;
  *(uint *)(out[7] + 1) = (uint)(iVar3 < (int)uVar75) * iVar3 | (iVar3 >= (int)uVar75) * uVar75;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar3 < (int)uVar77) * iVar3 | (iVar3 >= (int)uVar77) * uVar77;
  *(uint *)out[8] = (uint)(iVar3 < (int)uVar46) * iVar3 | (iVar3 >= (int)uVar46) * uVar46;
  *(uint *)((long)out[8] + 4) =
       (uint)(iVar3 < (int)uVar50) * iVar3 | (iVar3 >= (int)uVar50) * uVar50;
  *(uint *)(out[8] + 1) = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  *(uint *)((long)out[8] + 0xc) =
       (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  if (do_cols == 0) {
    iVar45 = 10;
    if (10 < bd) {
      iVar45 = bd;
    }
    iVar45 = 0x20 << ((byte)iVar45 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar45;
    clamp_hi_out[0]._0_4_ = iVar45 + -1;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    round_shift_8x8(out,out_shift);
    highbd_clamp_epi32_sse4_1(out,out,&clamp_lo_out,&clamp_hi_out,0x10);
  }
  return;
}

Assistant:

static void idct16x16_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[16], x, y;
  // stage 0
  // stage 1
  u[0] = in[0];
  u[2] = in[4];
  u[4] = in[2];
  u[6] = in[6];
  u[8] = in[1];
  u[10] = in[5];
  u[12] = in[3];
  u[14] = in[7];

  // stage 2
  u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
  u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);

  u[9] = half_btf_0_sse4_1(&cospim36, &u[14], &rnding, bit);
  u[14] = half_btf_0_sse4_1(&cospi28, &u[14], &rnding, bit);

  u[13] = half_btf_0_sse4_1(&cospi20, &u[10], &rnding, bit);
  u[10] = half_btf_0_sse4_1(&cospi44, &u[10], &rnding, bit);

  u[11] = half_btf_0_sse4_1(&cospim52, &u[12], &rnding, bit);
  u[12] = half_btf_0_sse4_1(&cospi12, &u[12], &rnding, bit);

  // stage 3
  u[7] = half_btf_0_sse4_1(&cospi8, &u[4], &rnding, bit);
  u[4] = half_btf_0_sse4_1(&cospi56, &u[4], &rnding, bit);
  u[5] = half_btf_0_sse4_1(&cospim40, &u[6], &rnding, bit);
  u[6] = half_btf_0_sse4_1(&cospi24, &u[6], &rnding, bit);

  addsub_sse4_1(u[8], u[9], &u[8], &u[9], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[11], u[10], &u[11], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[12], u[13], &u[12], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[15], u[14], &u[15], &u[14], &clamp_lo, &clamp_hi);

  // stage 4
  x = _mm_mullo_epi32(u[0], cospi32);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);
  u[1] = u[0];

  u[3] = half_btf_0_sse4_1(&cospi16, &u[2], &rnding, bit);
  u[2] = half_btf_0_sse4_1(&cospi48, &u[2], &rnding, bit);

  addsub_sse4_1(u[4], u[5], &u[4], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[6], &u[7], &u[6], &clamp_lo, &clamp_hi);

  x = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
  u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
  u[9] = x;
  y = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
  u[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
  u[10] = y;

  // stage 5
  addsub_sse4_1(u[0], u[3], &u[0], &u[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[2], &u[1], &u[2], &clamp_lo, &clamp_hi);

  x = _mm_mullo_epi32(u[5], cospi32);
  y = _mm_mullo_epi32(u[6], cospi32);
  u[5] = _mm_sub_epi32(y, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_add_epi32(y, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  addsub_sse4_1(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

  // stage 6
  addsub_sse4_1(u[0], u[7], &u[0], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[6], &u[1], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[5], &u[2], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[4], &u[3], &u[4], &clamp_lo, &clamp_hi);

  x = _mm_mullo_epi32(u[10], cospi32);
  y = _mm_mullo_epi32(u[13], cospi32);
  u[10] = _mm_sub_epi32(y, x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[13] = _mm_add_epi32(x, y);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[11], cospi32);
  y = _mm_mullo_epi32(u[12], cospi32);
  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  u[12] = _mm_add_epi32(x, y);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);
  // stage 7
  addsub_sse4_1(u[0], u[15], out + 0, out + 15, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[14], out + 1, out + 14, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[13], out + 2, out + 13, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[12], out + 3, out + 12, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[11], out + 4, out + 11, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[10], out + 5, out + 10, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[6], u[9], out + 6, out + 9, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[8], out + 7, out + 8, &clamp_lo, &clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 16);
  }
}